

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O0

int sam_hdr_add_PG(SAM_hdr *sh,char *name,...)

{
  char in_AL;
  int iVar1;
  char *pcVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  int local_58;
  int local_54;
  int nends;
  int i;
  int *end;
  va_list args;
  char *name_local;
  SAM_hdr *sh_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = local_108;
  args[0]._0_8_ = &stack0x00000008;
  end._4_4_ = 0x30;
  end._0_4_ = 0x10;
  local_f8 = in_RDX;
  local_f0 = in_RCX;
  local_e8 = in_R8;
  local_e0 = in_R9;
  if (sh->npg_end == 0) {
    pcVar2 = sam_hdr_PG_ID(sh,name);
    iVar1 = sam_hdr_vadd(sh,"PG",(__va_list_tag *)&end,"ID",pcVar2,"PN",name,0);
    if (iVar1 == -1) {
      return -1;
    }
  }
  else {
    _nends = malloc((long)sh->npg_end << 2);
    local_58 = sh->npg_end;
    if (_nends == (void *)0x0) {
      return -1;
    }
    memcpy(_nends,sh->pg_end,(long)local_58 << 2);
    for (local_54 = 0; local_54 < local_58; local_54 = local_54 + 1) {
      pcVar2 = sam_hdr_PG_ID(sh,name);
      iVar1 = sam_hdr_vadd(sh,"PG",(__va_list_tag *)&end,"ID",pcVar2,"PN",name,"PP",
                           sh->pg[*(int *)((long)_nends + (long)local_54 * 4)].name,0);
      if (iVar1 == -1) {
        free(_nends);
        return -1;
      }
    }
    free(_nends);
  }
  return 0;
}

Assistant:

int sam_hdr_add_PG(SAM_hdr *sh, const char *name, ...) {
    va_list args;
    va_start(args, name);

    if (sh->npg_end) {
	/* Copy ends array to avoid us looping while modifying it */
	int *end = malloc(sh->npg_end * sizeof(int));
	int i, nends = sh->npg_end;

	if (!end)
	    return -1;

	memcpy(end, sh->pg_end, nends * sizeof(*end));

	for (i = 0; i < nends; i++) {
	    if (-1 == sam_hdr_vadd(sh, "PG", args,
				   "ID", sam_hdr_PG_ID(sh, name),
				   "PN", name,
				   "PP", sh->pg[end[i]].name,
				   NULL)) {
		free(end);
		return  -1;
	    }
	}

	free(end);
    } else {
	if (-1 == sam_hdr_vadd(sh, "PG", args,
			       "ID", sam_hdr_PG_ID(sh, name),
			       "PN", name,
			       NULL))
	    return -1;
    }

    //sam_hdr_dump(sh);

    return 0;
}